

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

int __thiscall ncnn::YoloDetectionOutput::load_param(YoloDetectionOutput *this,ParamDict *pd)

{
  int iVar1;
  Mat *in_RSI;
  long in_RDI;
  float fVar2;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  ParamDict *in_stack_ffffffffffffff78;
  
  iVar1 = ParamDict::get((ParamDict *)in_RSI,0,0x14);
  *(int *)(in_RDI + 0xb8) = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,1,5);
  *(int *)(in_RDI + 0xbc) = iVar1;
  fVar2 = ParamDict::get((ParamDict *)in_RSI,2,0.01);
  *(float *)(in_RDI + 0xc0) = fVar2;
  fVar2 = ParamDict::get((ParamDict *)in_RSI,3,0.45);
  *(float *)(in_RDI + 0xc4) = fVar2;
  this_00 = (Mat *)&stack0xffffffffffffff70;
  Mat::Mat(this_00);
  ParamDict::get(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  Mat::operator=(this_00,in_RSI);
  Mat::~Mat((Mat *)0x1bdd8a);
  Mat::~Mat((Mat *)0x1bdd94);
  return 0;
}

Assistant:

int YoloDetectionOutput::load_param(const ParamDict& pd)
{
    num_class = pd.get(0, 20);
    num_box = pd.get(1, 5);
    confidence_threshold = pd.get(2, 0.01f);
    nms_threshold = pd.get(3, 0.45f);
    biases = pd.get(4, Mat());

    return 0;
}